

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O1

void __thiscall cmQtAutoGenInitializer::handleSkipPch(cmQtAutoGenInitializer *this,cmSourceFile *sf)

{
  cmSourceFile *this_00;
  bool bVar1;
  cmValue cVar2;
  _Hash_node_base *p_Var3;
  bool bVar4;
  string local_78;
  cmSourceFile *local_58;
  string local_50;
  
  p_Var3 = (this->AutogenTarget).Sources._M_h._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    bVar4 = true;
    local_58 = sf;
    do {
      bVar1 = cmSourceFile::GetIsGenerated((cmSourceFile *)p_Var3[1]._M_nxt,GlobalAndLocal);
      if (bVar1) {
        bVar1 = false;
      }
      else {
        this_00 = (cmSourceFile *)p_Var3[1]._M_nxt;
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_78,"SKIP_PRECOMPILE_HEADERS","");
        cVar2 = cmSourceFile::GetProperty(this_00,&local_78);
        bVar1 = cVar2.Value == (string *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      if (bVar1) {
        bVar4 = false;
      }
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
    sf = local_58;
    if (!bVar4) {
      return;
    }
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"SKIP_PRECOMPILE_HEADERS","");
  cmSourceFile::SetProperty(sf,&local_50,"ON");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmQtAutoGenInitializer::handleSkipPch(cmSourceFile* sf)
{
  bool skipPch = true;
  for (auto const& pair : this->AutogenTarget.Sources) {
    if (!pair.first->GetIsGenerated() &&
        !pair.first->GetProperty("SKIP_PRECOMPILE_HEADERS")) {
      skipPch = false;
    }
  }

  if (skipPch) {
    sf->SetProperty("SKIP_PRECOMPILE_HEADERS", "ON");
  }
}